

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOTemplate.cpp
# Opt level: O3

void __thiscall jbcoin::SOTemplate::push_back(SOTemplate *this,SOElement *r)

{
  undefined8 uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  __uniq_ptr_impl<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_> local_20;
  value_type_conflict2 local_14;
  
  piVar4 = (this->mIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->mIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 == piVar3) {
    local_14 = -1;
    std::vector<int,_std::allocator<int>_>::resize(&this->mIndex,(long)SField::num + 1,&local_14);
    piVar4 = (this->mIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->mIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((ulong)(long)r->e_field->fieldNum < (ulong)((long)piVar3 - (long)piVar4 >> 2)) {
    iVar2 = getIndex(this,r->e_field);
    if (iVar2 == -1) {
      (this->mIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[r->e_field->fieldNum] =
           (int)((ulong)((long)(this->mTypes).
                               super__Vector_base<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->mTypes).
                              super__Vector_base<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>,_std::allocator<std::unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_20._M_t.
      super__Tuple_impl<0UL,_const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>
      .super__Head_base<0UL,_const_jbcoin::SOElement_*,_false>._M_head_impl =
           (tuple<const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>)
           operator_new(0x10);
      uVar1 = *(undefined8 *)&r->flags;
      *(SField **)
       local_20._M_t.
       super__Tuple_impl<0UL,_const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>
       .super__Head_base<0UL,_const_jbcoin::SOElement_*,_false>._M_head_impl = r->e_field;
      *(undefined8 *)
       ((long)local_20._M_t.
              super__Tuple_impl<0UL,_const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>
              .super__Head_base<0UL,_const_jbcoin::SOElement_*,_false>._M_head_impl + 8) = uVar1;
      std::
      vector<std::unique_ptr<jbcoin::SOElement_const,std::default_delete<jbcoin::SOElement_const>>,std::allocator<std::unique_ptr<jbcoin::SOElement_const,std::default_delete<jbcoin::SOElement_const>>>>
      ::
      emplace_back<std::unique_ptr<jbcoin::SOElement_const,std::default_delete<jbcoin::SOElement_const>>>
                ((vector<std::unique_ptr<jbcoin::SOElement_const,std::default_delete<jbcoin::SOElement_const>>,std::allocator<std::unique_ptr<jbcoin::SOElement_const,std::default_delete<jbcoin::SOElement_const>>>>
                  *)this,(unique_ptr<const_jbcoin::SOElement,_std::default_delete<const_jbcoin::SOElement>_>
                          *)&local_20);
      if ((_Tuple_impl<0UL,_const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>
           )local_20._M_t.
            super__Tuple_impl<0UL,_const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>
            .super__Head_base<0UL,_const_jbcoin::SOElement_*,_false>._M_head_impl !=
          (SOElement *)0x0) {
        operator_delete((void *)local_20._M_t.
                                super__Tuple_impl<0UL,_const_jbcoin::SOElement_*,_std::default_delete<const_jbcoin::SOElement>_>
                                .super__Head_base<0UL,_const_jbcoin::SOElement_*,_false>.
                                _M_head_impl,0x10);
      }
      return;
    }
    __assert_fail("getIndex (r.e_field) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/SOTemplate.cpp"
                  ,0x2b,"void jbcoin::SOTemplate::push_back(const SOElement &)");
  }
  __assert_fail("r.e_field.getNum () < mIndex.size ()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/SOTemplate.cpp"
                ,0x27,"void jbcoin::SOTemplate::push_back(const SOElement &)");
}

Assistant:

void SOTemplate::push_back (SOElement const& r)
{
    // Ensure there is the enough space in the index mapping
    // table for all possible fields.
    //
    if (mIndex.empty ())
    {
        // Unmapped indices will be set to -1
        //
        mIndex.resize (SField::getNumFields () + 1, -1);
    }

    // Make sure the field's index is in range
    //
    assert (r.e_field.getNum () < mIndex.size ());

    // Make sure that this field hasn't already been assigned
    //
    assert (getIndex (r.e_field) == -1);

    // Add the field to the index mapping table
    //
    mIndex [r.e_field.getNum ()] = mTypes.size ();

    // Append the new element.
    //
    mTypes.push_back (std::make_unique<SOElement const> (r));
}